

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

bool canMergeFromBelow(QRect *top,QRect *bottom,QRect *nextToTop,QRect *nextToBottom)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  bool local_31;
  
  if (in_RDX != 0) {
    iVar1 = QRect::y((QRect *)0x652d4a);
    iVar2 = QRect::y((QRect *)0x652d58);
    if (iVar1 == iVar2) {
      return false;
    }
  }
  if (in_RCX != 0) {
    iVar1 = QRect::y((QRect *)0x652d7e);
    iVar2 = QRect::y((QRect *)0x652d8c);
    if (iVar1 == iVar2) {
      return false;
    }
  }
  iVar1 = QRect::bottom((QRect *)0x652daa);
  iVar2 = QRect::top((QRect *)0x652db8);
  local_31 = false;
  if (iVar2 + -1 <= iVar1) {
    iVar1 = QRect::left((QRect *)0x652dd5);
    iVar2 = QRect::left((QRect *)0x652de3);
    local_31 = false;
    if (iVar1 == iVar2) {
      iVar1 = QRect::right((QRect *)0x652dfd);
      iVar2 = QRect::right((QRect *)0x652e0b);
      local_31 = iVar1 == iVar2;
    }
  }
  return local_31;
}

Assistant:

static inline bool canMergeFromBelow(const QRect *top, const QRect *bottom,
                                     const QRect *nextToTop,
                                     const QRect *nextToBottom)
{
    if (nextToTop && nextToTop->y() == top->y())
        return false;
    if (nextToBottom && nextToBottom->y() == bottom->y())
        return false;

    return ((top->bottom() >= (bottom->top() - 1))
            && top->left() == bottom->left()
            && top->right() == bottom->right());
}